

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::OutputSampleMean
          (aggreports *this,int handle,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  int eptype_00;
  bool bVar1;
  int eptype_tvar_00;
  int in_R9D;
  int __tmp;
  vector<int,_std::allocator<int>_> local_48;
  
  if (this->outputFlags_[handle] == false) {
    return;
  }
  if (this->ordFlag_ == true) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (*this->fout_ == (FILE *)0x0) goto LAB_0010a876;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(4);
    *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
  }
  else {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(4);
    *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = handle;
  }
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + 1;
LAB_0010a876:
  bVar1 = this->ordFlag_;
  eptype_00 = ((uint)bVar1 + (uint)bVar1 ^ 2) + (uint)bVar1 * 4;
  eptype_tvar_00 = eptype * (uint)bVar1;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    SampleMean(this,&local_48,GetOutLoss,in_R9D,eptype_00,eptype_tvar_00);
  }
  else {
    SampleMeanWithWeighting(this,&local_48,GetOutLoss,in_R9D,eptype_00,eptype_tvar_00);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void aggreports::OutputSampleMean(const int handle, int eptype,
				  const int eptype_tvar,
				  OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  if (outputFlags_[handle] == false) return;

  std::vector<int> fileIDs = GetFileIDs(handle);

  // EPCalc = MEANSAMPLE for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * MEANSAMPLE + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    SampleMean(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);
    return;
  }

  SampleMeanWithWeighting(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);

}